

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_blocking_connection(config config)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  redisContext *c;
  int *piVar4;
  undefined8 uVar5;
  long lVar6;
  config *pcVar7;
  undefined8 *puVar8;
  config in_stack_ffffffffffffff88;
  
  pcVar7 = &config;
  puVar8 = (undefined8 *)&stack0xffffffffffffff88;
  for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *(undefined8 *)pcVar7;
    pcVar7 = (config *)&pcVar7->tcp;
    puVar8 = puVar8 + 1;
  }
  c = do_connect(in_stack_ffffffffffffff88);
  tests = tests + 1;
  printf("#%02d ");
  printf("Is able to deliver commands: ");
  piVar4 = (int *)redisCommand(c,"PING");
  if (*piVar4 == 5) {
    iVar3 = strcasecmp(*(char **)(piVar4 + 8),"pong");
    if (iVar3 != 0) goto LAB_00104246;
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
LAB_00104246:
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Is a able to send commands verbatim: ");
  piVar4 = (int *)redisCommand(c,"SET foo bar");
  if (*piVar4 == 5) {
    iVar3 = strcasecmp(*(char **)(piVar4 + 8),"ok");
    if (iVar3 != 0) goto LAB_001042bb;
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
LAB_001042bb:
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("%%s String interpolation works: ");
  uVar5 = redisCommand(c,"SET %s %s","foo","hello world");
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c,"GET foo");
  if (*piVar4 == 1) {
    iVar3 = strcmp(*(char **)(piVar4 + 8),"hello world");
    if (iVar3 != 0) goto LAB_00104357;
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
LAB_00104357:
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("%%b String interpolation works: ");
  uVar5 = redisCommand(c,"SET %b %b","foo",3,"hello",0xb);
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c,"GET foo");
  if (*piVar4 == 1) {
    iVar3 = bcmp(*(void **)(piVar4 + 8),"hello",0xb);
    if (iVar3 != 0) goto LAB_001043fd;
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
LAB_001043fd:
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  tests = tests + 1;
  printf("#%02d ");
  printf("Binary reply length is correct: ");
  if (*(long *)(piVar4 + 6) == 0xb) {
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can parse nil replies: ");
  piVar4 = (int *)redisCommand(c,"GET nokey");
  if (*piVar4 == 4) {
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can parse integer replies: ");
  piVar4 = (int *)redisCommand(c,"INCR mycounter");
  if ((*piVar4 == 3) && (*(long *)(piVar4 + 2) == 1)) {
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can parse multi bulk replies: ");
  uVar5 = redisCommand(c,"LPUSH mylist foo");
  freeReplyObject(uVar5);
  uVar5 = redisCommand(c,"LPUSH mylist bar");
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c,"LRANGE mylist 0 -1");
  if ((*piVar4 == 2) && (*(long *)(piVar4 + 10) == 2)) {
    plVar1 = *(long **)(piVar4 + 0xc);
    iVar3 = bcmp(*(void **)(*plVar1 + 0x20),"bar",3);
    if (iVar3 != 0) goto LAB_001045fe;
    iVar3 = bcmp(*(void **)(plVar1[1] + 0x20),"foo",3);
    if (iVar3 != 0) goto LAB_001045fe;
    puts("\x1b[0;32mPASSED\x1b[0;0m");
  }
  else {
LAB_001045fe:
    puts("\x1b[0;31mFAILED\x1b[0;0m");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can handle nested multi bulk replies: ");
  uVar5 = redisCommand(c,"MULTI");
  freeReplyObject(uVar5);
  uVar5 = redisCommand(c,"LRANGE mylist 0 -1");
  freeReplyObject(uVar5);
  uVar5 = redisCommand(c,"PING");
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c);
  if ((*piVar4 == 2) && (*(long *)(piVar4 + 10) == 2)) {
    puVar8 = *(undefined8 **)(piVar4 + 0xc);
    piVar2 = (int *)*puVar8;
    if ((*piVar2 == 2) && (*(long *)(piVar2 + 10) == 2)) {
      plVar1 = *(long **)(piVar2 + 0xc);
      iVar3 = bcmp(*(void **)(*plVar1 + 0x20),"bar",3);
      if (iVar3 == 0) {
        iVar3 = bcmp(*(void **)(plVar1[1] + 0x20),"foo",3);
        if ((iVar3 == 0) && (piVar2 = (int *)puVar8[1], *piVar2 == 5)) {
          iVar3 = strcasecmp(*(char **)(piVar2 + 8),"pong");
          if (iVar3 == 0) {
            puts("\x1b[0;32mPASSED\x1b[0;0m");
            goto LAB_0010472e;
          }
        }
      }
    }
  }
  puts("\x1b[0;31mFAILED\x1b[0;0m");
  fails = fails + 1;
LAB_0010472e:
  freeReplyObject(piVar4);
  disconnect(c,0);
  return;
}

Assistant:

static void test_blocking_connection(struct config config) {
    redisContext *c;
    redisReply *reply;

    c = do_connect(config);

    test("Is able to deliver commands: ");
    reply = redisCommand(c,"PING");
    test_cond(reply->type == REDIS_REPLY_STATUS &&
        strcasecmp(reply->str,"pong") == 0)
    freeReplyObject(reply);

    test("Is a able to send commands verbatim: ");
    reply = redisCommand(c,"SET foo bar");
    test_cond (reply->type == REDIS_REPLY_STATUS &&
        strcasecmp(reply->str,"ok") == 0)
    freeReplyObject(reply);

    test("%%s String interpolation works: ");
    reply = redisCommand(c,"SET %s %s","foo","hello world");
    freeReplyObject(reply);
    reply = redisCommand(c,"GET foo");
    test_cond(reply->type == REDIS_REPLY_STRING &&
        strcmp(reply->str,"hello world") == 0);
    freeReplyObject(reply);

    test("%%b String interpolation works: ");
    reply = redisCommand(c,"SET %b %b","foo",(size_t)3,"hello\x00world",(size_t)11);
    freeReplyObject(reply);
    reply = redisCommand(c,"GET foo");
    test_cond(reply->type == REDIS_REPLY_STRING &&
        memcmp(reply->str,"hello\x00world",11) == 0)

    test("Binary reply length is correct: ");
    test_cond(reply->len == 11)
    freeReplyObject(reply);

    test("Can parse nil replies: ");
    reply = redisCommand(c,"GET nokey");
    test_cond(reply->type == REDIS_REPLY_NIL)
    freeReplyObject(reply);

    /* test 7 */
    test("Can parse integer replies: ");
    reply = redisCommand(c,"INCR mycounter");
    test_cond(reply->type == REDIS_REPLY_INTEGER && reply->integer == 1)
    freeReplyObject(reply);

    test("Can parse multi bulk replies: ");
    freeReplyObject(redisCommand(c,"LPUSH mylist foo"));
    freeReplyObject(redisCommand(c,"LPUSH mylist bar"));
    reply = redisCommand(c,"LRANGE mylist 0 -1");
    test_cond(reply->type == REDIS_REPLY_ARRAY &&
              reply->elements == 2 &&
              !memcmp(reply->element[0]->str,"bar",3) &&
              !memcmp(reply->element[1]->str,"foo",3))
    freeReplyObject(reply);

    /* m/e with multi bulk reply *before* other reply.
     * specifically test ordering of reply items to parse. */
    test("Can handle nested multi bulk replies: ");
    freeReplyObject(redisCommand(c,"MULTI"));
    freeReplyObject(redisCommand(c,"LRANGE mylist 0 -1"));
    freeReplyObject(redisCommand(c,"PING"));
    reply = (redisCommand(c,"EXEC"));
    test_cond(reply->type == REDIS_REPLY_ARRAY &&
              reply->elements == 2 &&
              reply->element[0]->type == REDIS_REPLY_ARRAY &&
              reply->element[0]->elements == 2 &&
              !memcmp(reply->element[0]->element[0]->str,"bar",3) &&
              !memcmp(reply->element[0]->element[1]->str,"foo",3) &&
              reply->element[1]->type == REDIS_REPLY_STATUS &&
              strcasecmp(reply->element[1]->str,"pong") == 0);
    freeReplyObject(reply);

    disconnect(c, 0);
}